

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_JP2K.cpp
# Opt level: O1

MXFReader * __thiscall AS_02::JP2K::MXFReader::FillWriterInfo(MXFReader *this,WriterInfo *Info)

{
  long lVar1;
  char cVar2;
  long lVar3;
  undefined8 *in_RDX;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined1 *puVar6;
  byte bVar7;
  
  bVar7 = 0;
  puVar6 = Kumu::RESULT_INIT;
  if (*(long *)(Info->ProductUUID + 8) != 0) {
    cVar2 = (**(code **)(**(long **)(*(long *)(Info->ProductUUID + 8) + 0x10) + 0x40))();
    if (cVar2 != '\0') {
      lVar1 = *(long *)(Info->ProductUUID + 8);
      puVar4 = (undefined8 *)(lVar1 + 0x420);
      puVar5 = in_RDX;
      for (lVar3 = 8; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + (ulong)bVar7 * -2 + 1;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      }
      *(undefined2 *)(in_RDX + 8) = *(undefined2 *)(lVar1 + 0x460);
      std::__cxx11::string::_M_assign((string *)(in_RDX + 9));
      std::__cxx11::string::_M_assign((string *)(in_RDX + 0xd));
      std::__cxx11::string::_M_assign((string *)(in_RDX + 0x11));
      *(undefined4 *)(in_RDX + 0x15) = *(undefined4 *)(lVar1 + 0x4c8);
      puVar6 = Kumu::RESULT_OK;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar6);
  return this;
}

Assistant:

Result_t
AS_02::JP2K::MXFReader::FillWriterInfo(WriterInfo& Info) const
{
  if ( m_Reader && m_Reader->m_File->IsOpen() )
    {
      Info = m_Reader->m_Info;
      return RESULT_OK;
    }

  return RESULT_INIT;
}